

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgConvexHull3d.cpp
# Opt level: O3

void __thiscall
dgConvexHull3d::TessellateTriangle
          (dgConvexHull3d *this,HaI32 level,dgVector *p0,dgVector *p1,dgVector *p2,HaI32 *count,
          dgBigVector *ouput,HaI32 *start)

{
  ulong uVar1;
  dgTemplateVector<float> dVar2;
  dgTemplateVector<float> dVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined8 uVar12;
  bool bVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  uint uVar35;
  int iVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  double dVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  dgTemplateVector<float> local_60;
  dgTemplateVector<float> local_50;
  dgTemplateVector<float> local_40;
  undefined1 auVar43 [32];
  
  fVar70 = (p0->super_dgTemplateVector<float>).m_x;
  fVar51 = (p0->super_dgTemplateVector<float>).m_z;
  auVar38 = ZEXT416((uint)fVar70);
  if (level == 0) {
    fVar4 = (p0->super_dgTemplateVector<float>).m_y;
    auVar38._0_8_ = (double)fVar70;
    auVar38._8_8_ = 0;
    fVar5 = (p0->super_dgTemplateVector<float>).m_w;
    auVar37._0_8_ = (double)fVar51;
    auVar37._8_8_ = 0;
    dVar47 = (double)fVar4;
    if ((((((long)ABS(auVar38._0_8_) < 0x7ff0000000000000) && (!NAN(fVar70))) &&
         ((long)ABS(dVar47) < 0x7ff0000000000000)) &&
        ((!NAN(fVar4) && ((long)ABS(auVar37._0_8_) < 0x7ff0000000000000)))) &&
       ((!NAN(fVar51) && (((uint)ABS(fVar5) < 0x7f800000 && (!NAN(fVar5))))))) {
      dVar2 = p1->super_dgTemplateVector<float>;
      auVar55._0_12_ = ZEXT812(0);
      auVar55._12_4_ = 0;
      uVar12 = vcmpps_avx512vl((undefined1  [16])dVar2,auVar55,3);
      auVar55 = vshufps_avx((undefined1  [16])dVar2,(undefined1  [16])dVar2,0xe9);
      auVar55 = vcvtps2pd_avx(auVar55);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0x7fffffffffffffff;
      auVar39._12_4_ = 0x7fffffff;
      auVar39 = vpandq_avx512vl(auVar55,auVar39);
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0x7fefffffffffffff;
      auVar40._12_4_ = 0x7fefffff;
      uVar15 = vpcmpgtq_avx512vl(auVar39,auVar40);
      uVar35 = vextractps_avx((undefined1  [16])dVar2,3);
      if ((((uVar15 & 1) == 0 &&
           ((char)uVar12 == '\0' && (long)ABS((double)dVar2.m_x) < 0x7ff0000000000000)) &&
           (uVar15 & 3) >> 1 == 0) && ((uVar35 & 0x7fffffff) < 0x7f800000)) {
        dVar3 = p2->super_dgTemplateVector<float>;
        uVar12 = vcmpps_avx512vl((undefined1  [16])dVar3,(undefined1  [16])0x0,3);
        auVar39 = vshufps_avx((undefined1  [16])dVar3,(undefined1  [16])dVar3,0xe9);
        auVar39 = vcvtps2pd_avx(auVar39);
        auVar60._8_4_ = 0xffffffff;
        auVar60._0_8_ = 0x7fffffffffffffff;
        auVar60._12_4_ = 0x7fffffff;
        auVar40 = vpandq_avx512vl(auVar39,auVar60);
        auVar32._8_4_ = 0xffffffff;
        auVar32._0_8_ = 0x7fefffffffffffff;
        auVar32._12_4_ = 0x7fefffff;
        uVar15 = vpcmpgtq_avx512vl(auVar40,auVar32);
        uVar35 = vextractps_avx((undefined1  [16])dVar3,3);
        if ((((uVar15 & 1) == 0 &&
             ((char)uVar12 == '\0' && (long)ABS((double)dVar3.m_x) < 0x7ff0000000000000)) &&
             (uVar15 & 3) >> 1 == 0) && ((uVar35 & 0x7fffffff) < 0x7f800000)) {
          dVar54 = (double)dVar2.m_x - auVar38._0_8_;
          auVar40 = vshufpd_avx(auVar55,auVar55,1);
          dVar7 = auVar39._0_8_ - dVar47;
          dVar8 = auVar55._0_8_ - dVar47;
          dVar9 = (double)dVar3.m_x - auVar38._0_8_;
          dVar10 = auVar40._0_8_ - auVar37._0_8_;
          auVar55 = vshufpd_avx(auVar39,auVar39,1);
          dVar11 = auVar55._0_8_ - auVar37._0_8_;
          auVar53._8_8_ = 0;
          auVar53._0_8_ = dVar7 * dVar10;
          auVar56._8_8_ = 0;
          auVar56._0_8_ = dVar11;
          auVar67._8_8_ = 0;
          auVar67._0_8_ = dVar8;
          auVar55 = vfmsub231sd_fma(auVar53,auVar67,auVar56);
          auVar57._8_8_ = 0;
          auVar57._0_8_ = dVar11 * dVar54;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = dVar9;
          auVar69._8_8_ = 0;
          auVar69._0_8_ = dVar10;
          auVar39 = vfmsub231sd_fma(auVar57,auVar61,auVar69);
          auVar62._8_8_ = 0;
          auVar62._0_8_ = dVar8 * dVar9;
          auVar64._8_8_ = 0;
          auVar64._0_8_ = dVar54;
          auVar72._8_8_ = 0;
          auVar72._0_8_ = dVar7;
          auVar40 = vfmsub231sd_fma(auVar62,auVar64,auVar72);
          dVar54 = auVar39._0_8_;
          if (((auVar55._0_8_ & 0x7fffffffffffffff) < 0x7ff0000000000000) &&
             (((ulong)ABS(dVar54) < 0x7ff0000000000000 &&
              ((auVar40._0_8_ & 0x7fffffffffffffff) < 0x7ff0000000000000)))) {
            auVar50._8_8_ = 0;
            auVar50._0_8_ = dVar54 * dVar47;
            auVar38 = vfmadd213sd_fma(auVar38,auVar55,auVar50);
            auVar38 = vfmadd213sd_fma(auVar37,auVar40,auVar38);
            auVar33._12_4_ = 0x80000000;
            auVar33._0_12_ = ZEXT812(0x8000000000000000);
            auVar37 = vxorpd_avx512vl(auVar38,auVar33);
            auVar46._8_8_ = 0;
            auVar46._0_8_ = dVar54 * dVar54;
            auVar38 = vfmadd231sd_fma(auVar46,auVar55,auVar55);
            auVar38 = vfmadd231sd_fma(auVar38,auVar40,auVar40);
            auVar38 = vsqrtsd_avx(auVar38,auVar38);
            auVar37 = vunpcklpd_avx(auVar40,auVar37);
            dVar47 = 1.0 / auVar38._0_8_;
            auVar38 = vunpcklpd_avx(auVar55,auVar39);
            auVar42._0_8_ = dVar47 * auVar38._0_8_;
            auVar42._8_8_ = dVar47 * auVar38._8_8_;
            auVar43._16_8_ = dVar47 * auVar37._0_8_;
            auVar43._0_16_ = auVar42;
            auVar43._24_8_ = dVar47 * auVar37._8_8_;
            auVar41._8_4_ = 0xffffffff;
            auVar41._0_8_ = 0x7fffffffffffffff;
            auVar41._12_4_ = 0x7fffffff;
            auVar41._16_8_ = 0x7fffffffffffffff;
            auVar41._24_8_ = 0x7fffffffffffffff;
            auVar41 = vandpd_avx512vl(auVar43,auVar41);
            auVar34._8_4_ = 0xffffffff;
            auVar34._0_8_ = 0x7fefffffffffffff;
            auVar34._12_4_ = 0x7fefffff;
            auVar34._16_8_ = 0x7fefffffffffffff;
            auVar34._24_8_ = 0x7fefffffffffffff;
            uVar15 = vpcmpgtq_avx512vl(auVar41,auVar34);
            if ((uVar15 & 0xf) == 0) {
              auVar38 = vshufpd_avx(auVar42,auVar42,1);
              if (!NAN(auVar38._0_8_)) {
                uVar15 = vcmppd_avx512vl(auVar43._16_16_,ZEXT816(0) << 0x40,3);
                if (((uVar15 & 1) == 0) && ((uVar15 & 3) >> 1 == 0)) {
                  iVar36 = *start;
                  dVar47 = (double)vmovlpd_avx(auVar42);
                  ouput[iVar36].super_dgTemplateVector<double>.m_x = dVar47;
                  ouput[iVar36].super_dgTemplateVector<double>.m_y = auVar38._0_8_;
                  dVar47 = (double)vmovlpd_avx(auVar43._16_16_);
                  ouput[iVar36].super_dgTemplateVector<double>.m_z = dVar47;
                  ouput[iVar36].super_dgTemplateVector<double>.m_w = 0.0;
                  *start = *start + 8;
                  *count = *count + 1;
                  return;
                }
              }
            }
            __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                          ,0x159,
                          "dgBigVector::dgBigVector(hacd::HaF64, hacd::HaF64, hacd::HaF64, hacd::HaF64)"
                         );
          }
          __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                        ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
        }
      }
    }
    __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                  ,0x13f,"dgBigVector::dgBigVector(const dgVector &)");
  }
  fVar70 = (p0->super_dgTemplateVector<float>).m_y;
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar70 * fVar70)),auVar38,auVar38);
  auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar51),ZEXT416((uint)fVar51));
  fVar4 = auVar37._0_4_ + -1.0;
  auVar16._8_4_ = 0x80000000;
  auVar16._0_8_ = 0x8000000080000000;
  auVar16._12_4_ = 0x80000000;
  auVar37 = vxorps_avx512vl(ZEXT416((uint)fVar4),auVar16);
  uVar12 = vcmpss_avx512f(auVar37,ZEXT416((uint)fVar4),2);
  bVar13 = (bool)((byte)uVar12 & 1);
  if (0.0001 <= (float)((uint)bVar13 * (int)fVar4 + (uint)!bVar13 * auVar37._0_4_)) {
    __assert_fail("dgAbsf (p0 % p0 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                  ,0x1c8,
                  "void dgConvexHull3d::TessellateTriangle(hacd::HaI32, const dgVector &, const dgVector &, const dgVector &, hacd::HaI32 &, dgBigVector *const, hacd::HaI32 &) const"
                 );
  }
  uVar15._0_4_ = (p1->super_dgTemplateVector<float>).m_x;
  uVar15._4_4_ = (p1->super_dgTemplateVector<float>).m_y;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar15;
  auVar58._0_4_ = (float)(undefined4)uVar15 * (float)(undefined4)uVar15;
  auVar58._4_4_ = (float)uVar15._4_4_ * (float)uVar15._4_4_;
  auVar58._8_8_ = 0;
  auVar37 = vmovshdup_avx(auVar58);
  fVar4 = (p1->super_dgTemplateVector<float>).m_z;
  auVar37 = vfmadd231ss_fma(auVar37,auVar48,auVar48);
  auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
  fVar5 = auVar37._0_4_ + -1.0;
  auVar17._8_4_ = 0x80000000;
  auVar17._0_8_ = 0x8000000080000000;
  auVar17._12_4_ = 0x80000000;
  auVar37 = vxorps_avx512vl(ZEXT416((uint)fVar5),auVar17);
  uVar12 = vcmpss_avx512f(auVar37,ZEXT416((uint)fVar5),2);
  bVar13 = (bool)((byte)uVar12 & 1);
  if ((float)((uint)bVar13 * (int)fVar5 + (uint)!bVar13 * auVar37._0_4_) < 0.0001) {
    uVar1._0_4_ = (p2->super_dgTemplateVector<float>).m_x;
    uVar1._4_4_ = (p2->super_dgTemplateVector<float>).m_y;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar1;
    fVar5 = (p2->super_dgTemplateVector<float>).m_z;
    auVar63._0_4_ = (float)(undefined4)uVar1 * (float)(undefined4)uVar1;
    auVar63._4_4_ = (float)uVar1._4_4_ * (float)uVar1._4_4_;
    auVar63._8_8_ = 0;
    auVar37 = vmovshdup_avx(auVar63);
    auVar37 = vfmadd231ss_fma(auVar37,auVar68,auVar68);
    auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
    fVar6 = auVar37._0_4_ + -1.0;
    auVar18._8_4_ = 0x80000000;
    auVar18._0_8_ = 0x8000000080000000;
    auVar18._12_4_ = 0x80000000;
    auVar37 = vxorps_avx512vl(ZEXT416((uint)fVar6),auVar18);
    uVar12 = vcmpss_avx512f(auVar37,ZEXT416((uint)fVar6),2);
    bVar13 = (bool)((byte)uVar12 & 1);
    if (0.0001 <= (float)((uint)bVar13 * (int)fVar6 + (uint)!bVar13 * auVar37._0_4_)) {
      __assert_fail("dgAbsf (p2 % p2 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x1ca,
                    "void dgConvexHull3d::TessellateTriangle(hacd::HaI32, const dgVector &, const dgVector &, const dgVector &, hacd::HaI32 &, dgBigVector *const, hacd::HaI32 &) const"
                   );
    }
    auVar38 = vinsertps_avx(auVar38,ZEXT416((uint)fVar70),0x10);
    fVar70 = fVar51 + fVar4;
    auVar73._0_4_ = auVar38._0_4_ + (float)(undefined4)uVar15;
    auVar73._4_4_ = auVar38._4_4_ + (float)uVar15._4_4_;
    auVar73._8_4_ = auVar38._8_4_ + 0.0;
    auVar73._12_4_ = auVar38._12_4_ + 0.0;
    auVar37 = vinsertps_avx(auVar73,ZEXT416((uint)fVar70),0x20);
    auVar55 = ZEXT416((uint)(p0->super_dgTemplateVector<float>).m_w);
    auVar37 = vinsertps_avx(auVar37,auVar55,0x30);
    auVar19._8_4_ = 0x7fffffff;
    auVar19._0_8_ = 0x7fffffff7fffffff;
    auVar19._12_4_ = 0x7fffffff;
    auVar37 = vandps_avx512vl(auVar37,auVar19);
    auVar20._8_4_ = 0x7f7fffff;
    auVar20._0_8_ = 0x7f7fffff7f7fffff;
    auVar20._12_4_ = 0x7f7fffff;
    uVar14 = vpcmpgtd_avx512vl(auVar37,auVar20);
    if ((uVar14 & 0xf) == 0) {
      auVar65._0_4_ = (float)(undefined4)uVar1 + (float)(undefined4)uVar15;
      auVar65._4_4_ = (float)uVar1._4_4_ + (float)uVar15._4_4_;
      auVar65._8_8_ = 0;
      fVar4 = fVar5 + fVar4;
      auVar37 = vinsertps_avx(auVar65,ZEXT416((uint)fVar4),0x20);
      auVar39 = ZEXT416((uint)(p1->super_dgTemplateVector<float>).m_w);
      auVar37 = vinsertps_avx(auVar37,auVar39,0x30);
      auVar21._8_4_ = 0x7fffffff;
      auVar21._0_8_ = 0x7fffffff7fffffff;
      auVar21._12_4_ = 0x7fffffff;
      auVar37 = vandps_avx512vl(auVar37,auVar21);
      auVar22._8_4_ = 0x7f7fffff;
      auVar22._0_8_ = 0x7f7fffff7f7fffff;
      auVar22._12_4_ = 0x7f7fffff;
      uVar15 = vpcmpgtd_avx512vl(auVar37,auVar22);
      if ((uVar15 & 0xf) == 0) {
        auVar59._0_4_ = (float)(undefined4)uVar1 + auVar38._0_4_;
        auVar59._4_4_ = (float)uVar1._4_4_ + auVar38._4_4_;
        auVar59._8_4_ = auVar38._8_4_ + 0.0;
        auVar59._12_4_ = auVar38._12_4_ + 0.0;
        fVar5 = fVar5 + fVar51;
        auVar38 = vinsertps_avx(auVar59,ZEXT416((uint)fVar5),0x20);
        auVar37 = ZEXT416((uint)(p2->super_dgTemplateVector<float>).m_w);
        auVar38 = vinsertps_avx(auVar38,auVar37,0x30);
        auVar23._8_4_ = 0x7fffffff;
        auVar23._0_8_ = 0x7fffffff7fffffff;
        auVar23._12_4_ = 0x7fffffff;
        auVar38 = vandps_avx512vl(auVar38,auVar23);
        auVar24._8_4_ = 0x7f7fffff;
        auVar24._0_8_ = 0x7f7fffff7f7fffff;
        auVar24._12_4_ = 0x7f7fffff;
        uVar15 = vpcmpgtd_avx512vl(auVar38,auVar24);
        if ((uVar15 & 0xf) == 0) {
          auVar49._0_4_ = auVar73._0_4_ * auVar73._0_4_;
          auVar49._4_4_ = auVar73._4_4_ * auVar73._4_4_;
          auVar49._8_4_ = auVar73._8_4_ * auVar73._8_4_;
          auVar49._12_4_ = auVar73._12_4_ * auVar73._12_4_;
          auVar38 = vmovshdup_avx(auVar49);
          auVar38 = vfmadd231ss_fma(auVar38,auVar73,auVar73);
          auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar70),ZEXT416((uint)fVar70));
          auVar38 = vsqrtss_avx(auVar38,auVar38);
          fVar51 = 1.0 / auVar38._0_4_;
          auVar52._0_4_ = auVar73._0_4_ * fVar51;
          auVar52._4_4_ = auVar73._4_4_ * fVar51;
          auVar52._8_4_ = auVar73._8_4_ * fVar51;
          auVar52._12_4_ = auVar73._12_4_ * fVar51;
          auVar25._8_4_ = 0x7fffffff;
          auVar25._0_8_ = 0x7fffffff7fffffff;
          auVar25._12_4_ = 0x7fffffff;
          auVar38 = vandps_avx512vl(auVar52,auVar25);
          auVar26._8_4_ = 0x7f7fffff;
          auVar26._0_8_ = 0x7f7fffff7f7fffff;
          auVar26._12_4_ = 0x7f7fffff;
          uVar15 = vpcmpgtd_avx512vl(auVar38,auVar26);
          if ((((uVar15 & 1) == 0) && (((uVar15 & 0xf) >> 1 & 1) == 0)) &&
             ((uint)ABS(fVar70 * fVar51) < 0x7f800000)) {
            auVar40 = ZEXT416((uint)(fVar70 * fVar51));
            auVar38 = vinsertps_avx(auVar40,auVar55,0x10);
            local_50 = (dgTemplateVector<float>)vmovlhps_avx(auVar52,auVar38);
            auVar71._0_4_ = auVar65._0_4_ * auVar65._0_4_;
            auVar71._4_4_ = auVar65._4_4_ * auVar65._4_4_;
            auVar71._8_8_ = 0;
            auVar38 = vmovshdup_avx(auVar71);
            auVar38 = vfmadd231ss_fma(auVar38,auVar65,auVar65);
            auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
            auVar38 = vsqrtss_avx(auVar38,auVar38);
            fVar70 = 1.0 / auVar38._0_4_;
            auVar66._0_4_ = auVar65._0_4_ * fVar70;
            auVar66._4_4_ = auVar65._4_4_ * fVar70;
            auVar66._8_4_ = fVar70 * 0.0;
            auVar66._12_4_ = fVar70 * 0.0;
            auVar27._8_4_ = 0x7fffffff;
            auVar27._0_8_ = 0x7fffffff7fffffff;
            auVar27._12_4_ = 0x7fffffff;
            auVar38 = vandps_avx512vl(auVar66,auVar27);
            auVar28._8_4_ = 0x7f7fffff;
            auVar28._0_8_ = 0x7f7fffff7f7fffff;
            auVar28._12_4_ = 0x7f7fffff;
            uVar15 = vpcmpgtd_avx512vl(auVar38,auVar28);
            if ((((uVar15 & 1) == 0) && (((uVar15 & 0xf) >> 1 & 1) == 0)) &&
               ((uint)ABS(fVar70 * fVar4) < 0x7f800000)) {
              auVar55 = ZEXT416((uint)(fVar70 * fVar4));
              auVar38 = vinsertps_avx(auVar55,auVar39,0x10);
              local_40 = (dgTemplateVector<float>)vmovlhps_avx(auVar66,auVar38);
              auVar38 = vmovshdup_avx(auVar59);
              fVar70 = auVar38._0_4_;
              auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar70 * fVar70)),auVar59,auVar59);
              auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
              auVar38 = vsqrtss_avx(auVar38,auVar38);
              fVar51 = 1.0 / auVar38._0_4_;
              fVar70 = fVar51 * fVar70;
              if ((((uint)ABS(fVar51 * auVar59._0_4_) < 0x7f800000) &&
                  ((uint)ABS(fVar70) < 0x7f800000)) && ((uint)ABS(fVar51 * fVar5) < 0x7f800000)) {
                auVar39 = ZEXT416((uint)(fVar51 * fVar5));
                auVar38 = vinsertps_avx(auVar39,auVar37,0x10);
                auVar60 = ZEXT416((uint)(fVar51 * auVar59._0_4_));
                auVar37 = vinsertps_avx(auVar60,ZEXT416((uint)fVar70),0x10);
                local_60 = (dgTemplateVector<float>)vmovlhps_avx(auVar37,auVar38);
                auVar44._0_4_ = auVar52._0_4_ * auVar52._0_4_;
                auVar44._4_4_ = auVar52._4_4_ * auVar52._4_4_;
                auVar44._8_4_ = auVar52._8_4_ * auVar52._8_4_;
                auVar44._12_4_ = auVar52._12_4_ * auVar52._12_4_;
                auVar38 = vmovshdup_avx(auVar44);
                auVar38 = vfmadd231ss_fma(auVar38,auVar52,auVar52);
                auVar38 = vfmadd213ss_fma(auVar40,auVar40,auVar38);
                fVar51 = auVar38._0_4_ + -1.0;
                auVar29._8_4_ = 0x80000000;
                auVar29._0_8_ = 0x8000000080000000;
                auVar29._12_4_ = 0x80000000;
                auVar38 = vxorps_avx512vl(ZEXT416((uint)fVar51),auVar29);
                uVar12 = vcmpss_avx512f(auVar38,ZEXT416((uint)fVar51),2);
                bVar13 = (bool)((byte)uVar12 & 1);
                if (0.0001 <= (float)((uint)bVar13 * (int)fVar51 + (uint)!bVar13 * auVar38._0_4_)) {
                  __assert_fail("dgAbsf (p01 % p01 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                                ,0x1d3,
                                "void dgConvexHull3d::TessellateTriangle(hacd::HaI32, const dgVector &, const dgVector &, const dgVector &, hacd::HaI32 &, dgBigVector *const, hacd::HaI32 &) const"
                               );
                }
                auVar45._0_4_ = auVar66._0_4_ * auVar66._0_4_;
                auVar45._4_4_ = auVar66._4_4_ * auVar66._4_4_;
                auVar45._8_4_ = auVar66._8_4_ * auVar66._8_4_;
                auVar45._12_4_ = auVar66._12_4_ * auVar66._12_4_;
                auVar38 = vmovshdup_avx(auVar45);
                auVar38 = vfmadd231ss_fma(auVar38,auVar66,auVar66);
                auVar38 = vfmadd213ss_fma(auVar55,auVar55,auVar38);
                fVar51 = auVar38._0_4_ + -1.0;
                auVar30._8_4_ = 0x80000000;
                auVar30._0_8_ = 0x8000000080000000;
                auVar30._12_4_ = 0x80000000;
                auVar38 = vxorps_avx512vl(ZEXT416((uint)fVar51),auVar30);
                uVar12 = vcmpss_avx512f(auVar38,ZEXT416((uint)fVar51),2);
                bVar13 = (bool)((byte)uVar12 & 1);
                if ((float)((uint)bVar13 * (int)fVar51 + (uint)!bVar13 * auVar38._0_4_) < 0.0001) {
                  auVar38 = vfmadd213ss_fma(auVar60,auVar60,ZEXT416((uint)(fVar70 * fVar70)));
                  auVar38 = vfmadd213ss_fma(auVar39,auVar39,auVar38);
                  fVar70 = auVar38._0_4_ + -1.0;
                  auVar31._8_4_ = 0x80000000;
                  auVar31._0_8_ = 0x8000000080000000;
                  auVar31._12_4_ = 0x80000000;
                  auVar38 = vxorps_avx512vl(ZEXT416((uint)fVar70),auVar31);
                  uVar12 = vcmpss_avx512f(auVar38,ZEXT416((uint)fVar70),2);
                  bVar13 = (bool)((byte)uVar12 & 1);
                  if ((float)((uint)bVar13 * (int)fVar70 + (uint)!bVar13 * auVar38._0_4_) < 0.0001)
                  {
                    iVar36 = level + -1;
                    TessellateTriangle(this,iVar36,p0,(dgVector *)&local_50,(dgVector *)&local_60,
                                       count,ouput,start);
                    TessellateTriangle(this,iVar36,p1,(dgVector *)&local_40,(dgVector *)&local_50,
                                       count,ouput,start);
                    TessellateTriangle(this,iVar36,p2,(dgVector *)&local_60,(dgVector *)&local_40,
                                       count,ouput,start);
                    TessellateTriangle(this,iVar36,(dgVector *)&local_50,(dgVector *)&local_40,
                                       (dgVector *)&local_60,count,ouput,start);
                    return;
                  }
                  __assert_fail("dgAbsf (p20 % p20 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                                ,0x1d5,
                                "void dgConvexHull3d::TessellateTriangle(hacd::HaI32, const dgVector &, const dgVector &, const dgVector &, hacd::HaI32 &, dgBigVector *const, hacd::HaI32 &) const"
                               );
                }
                __assert_fail("dgAbsf (p12 % p12 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                              ,0x1d4,
                              "void dgConvexHull3d::TessellateTriangle(hacd::HaI32, const dgVector &, const dgVector &, const dgVector &, hacd::HaI32 &, dgBigVector *const, hacd::HaI32 &) const"
                             );
              }
            }
          }
        }
      }
    }
    __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                  ,0x121,"dgVector::dgVector(const dgTemplateVector<hacd::HaF32> &)");
  }
  __assert_fail("dgAbsf (p1 % p1 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                ,0x1c9,
                "void dgConvexHull3d::TessellateTriangle(hacd::HaI32, const dgVector &, const dgVector &, const dgVector &, hacd::HaI32 &, dgBigVector *const, hacd::HaI32 &) const"
               );
}

Assistant:

void dgConvexHull3d::TessellateTriangle (hacd::HaI32 level, const dgVector& p0, const dgVector& p1, const dgVector& p2, hacd::HaI32& count, dgBigVector* const ouput, hacd::HaI32& start) const
{
	if (level) {
		HACD_ASSERT (dgAbsf (p0 % p0 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f));
		HACD_ASSERT (dgAbsf (p1 % p1 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f));
		HACD_ASSERT (dgAbsf (p2 % p2 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f));
		dgVector p01 (p0 + p1);
		dgVector p12 (p1 + p2);
		dgVector p20 (p2 + p0);

		p01 = p01.Scale (hacd::HaF32 (1.0f) / dgSqrt(p01 % p01));
		p12 = p12.Scale (hacd::HaF32 (1.0f) / dgSqrt(p12 % p12));
		p20 = p20.Scale (hacd::HaF32 (1.0f) / dgSqrt(p20 % p20));

		HACD_ASSERT (dgAbsf (p01 % p01 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f));
		HACD_ASSERT (dgAbsf (p12 % p12 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f));
		HACD_ASSERT (dgAbsf (p20 % p20 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f));

		TessellateTriangle  (level - 1, p0,  p01, p20, count, ouput, start);
		TessellateTriangle  (level - 1, p1,  p12, p01, count, ouput, start);
		TessellateTriangle  (level - 1, p2,  p20, p12, count, ouput, start);
		TessellateTriangle  (level - 1, p01, p12, p20, count, ouput, start);

	} else {
		dgBigPlane n (p0, p1, p2);
		n = n.Scale (hacd::HaF64(1.0f) / sqrt (n % n));
		n.m_w = hacd::HaF64(0.0f);
		ouput[start] = n;
		start += 8;
		count ++;
	}
}